

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O1

void __thiscall leveldb::BlockBuilder::Reset(BlockBuilder *this)

{
  pointer puVar1;
  iterator __position;
  long in_FS_OFFSET;
  uint local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->buffer_)._M_string_length = 0;
  *(this->buffer_)._M_dataplus._M_p = '\0';
  puVar1 = (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  local_14 = 0;
  __position._M_current =
       (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->restarts_,__position,&local_14);
  }
  else {
    *__position._M_current = 0;
    (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  this->counter_ = 0;
  this->finished_ = false;
  (this->last_key_)._M_string_length = 0;
  *(this->last_key_)._M_dataplus._M_p = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockBuilder::Reset() {
  buffer_.clear();
  restarts_.clear();
  restarts_.push_back(0);  // First restart point is at offset 0
  counter_ = 0;
  finished_ = false;
  last_key_.clear();
}